

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evdevPlus.cpp
# Opt level: O2

void __thiscall evdevPlus::EventDevice::__open(EventDevice *this,string *path,int open_flags)

{
  int iVar1;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  
  iVar1 = open((path->_M_dataplus)._M_p,open_flags);
  if (-1 < iVar1) {
    std::__cxx11::string::_M_assign((string *)&this->path_);
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_00,iVar1,__ecat,"failed to open device");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void EventDevice::__open(const std::string &path, int open_flags) {
	int fd = open(path.c_str(), open_flags);

	if (fd < 0)
		throw std::system_error(errno, std::system_category(), "failed to open device");

	path_ = path;

}